

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

int32_t __thiscall
icu_63::MessagePattern::parseMessage
          (MessagePattern *this,int32_t index,int32_t msgStartLength,int32_t nestingLevel,
          UMessagePatternArgType parentType,UParseError *parseError,UErrorCode *errorCode)

{
  UnicodeString *this_00;
  short sVar1;
  int32_t start;
  char16_t cVar2;
  int iVar3;
  int32_t index_00;
  int index_01;
  int32_t offset;
  bool bVar4;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (nestingLevel < 0x8000) {
      start = this->partsLength;
      addPart(this,UMSGPAT_PART_TYPE_MSG_START,index,msgStartLength,nestingLevel,errorCode);
      this_00 = &this->msg;
      bVar4 = (parentType - UMSGPAT_ARG_TYPE_PLURAL & 0xfffffffd) == 0;
      offset = msgStartLength + index;
LAB_00281914:
      do {
        while( true ) {
          while( true ) {
            index_01 = offset;
            if (U_ZERO_ERROR < *errorCode) {
              return 0;
            }
            sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar3 = (this->msg).fUnion.fFields.fLength;
            }
            else {
              iVar3 = (int)sVar1 >> 5;
            }
            if (iVar3 <= index_01) {
              if ((0 < nestingLevel) &&
                 ((nestingLevel != 1 || parentType != UMSGPAT_ARG_TYPE_CHOICE ||
                  (((this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.
                   ptr)->type == UMSGPAT_PART_TYPE_MSG_START)))) {
                setParseError(this,parseError,0);
                *errorCode = U_UNMATCHED_BRACES;
                return 0;
              }
              addLimitPart(this,start,UMSGPAT_PART_TYPE_MSG_LIMIT,index_01,0,nestingLevel,errorCode)
              ;
              return index_01;
            }
            offset = index_01 + 1;
            cVar2 = UnicodeString::doCharAt(this_00,index_01);
            if (cVar2 == L'\'') break;
            if (bVar4 && cVar2 == L'#') {
              addPart(this,UMSGPAT_PART_TYPE_REPLACE_NUMBER,index_01,1,0,errorCode);
            }
            else if (cVar2 == L'{') {
              offset = parseArg(this,index_01,1,nestingLevel,parseError,errorCode);
            }
            else if ((0 < nestingLevel && cVar2 == L'}') ||
                    (parentType == UMSGPAT_ARG_TYPE_CHOICE && cVar2 == L'|')) {
              if (parentType == UMSGPAT_ARG_TYPE_CHOICE) {
                offset = index_01;
              }
              addLimitPart(this,start,UMSGPAT_PART_TYPE_MSG_LIMIT,index_01,
                           (uint)(parentType != UMSGPAT_ARG_TYPE_CHOICE || cVar2 != L'}'),
                           nestingLevel,errorCode);
              return offset;
            }
          }
          sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar3 = (this->msg).fUnion.fFields.fLength;
          }
          else {
            iVar3 = (int)sVar1 >> 5;
          }
          if (offset != iVar3) break;
LAB_00281994:
          addPart(this,UMSGPAT_PART_TYPE_INSERT_CHAR,offset,0,0x27,errorCode);
          this->needsAutoQuoting = '\x01';
        }
        cVar2 = UnicodeString::doCharAt(this_00,offset);
        if (cVar2 == L'\'') {
          addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,offset,1,0,errorCode);
          offset = index_01 + 2;
          goto LAB_00281914;
        }
        if ((((this->aposMode != UMSGPAT_APOS_DOUBLE_REQUIRED) && (cVar2 != L'{')) &&
            (cVar2 != L'}')) &&
           ((cVar2 != L'#' || !bVar4) && (cVar2 != L'|' || parentType != UMSGPAT_ARG_TYPE_CHOICE)))
        goto LAB_00281994;
        do {
          addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,index_01,1,0,errorCode);
          index_00 = UnicodeString::indexOf(this_00,L'\'',offset + 1);
          if (index_00 < 0) {
            sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              offset = (this->msg).fUnion.fFields.fLength;
            }
            else {
              offset = (int)sVar1 >> 5;
            }
            goto LAB_00281994;
          }
          offset = index_00 + 1;
          cVar2 = UnicodeString::doCharAt(this_00,offset);
          index_01 = offset;
        } while (cVar2 == L'\'');
        addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,index_00,1,0,errorCode);
      } while( true );
    }
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return 0;
}

Assistant:

int32_t
MessagePattern::parseMessage(int32_t index, int32_t msgStartLength,
                             int32_t nestingLevel, UMessagePatternArgType parentType,
                             UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(nestingLevel>Part::MAX_VALUE) {
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    int32_t msgStart=partsLength;
    addPart(UMSGPAT_PART_TYPE_MSG_START, index, msgStartLength, nestingLevel, errorCode);
    index+=msgStartLength;
    for(;;) {  // while(index<msg.length()) with U_FAILURE(errorCode) check
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        if(index>=msg.length()) {
            break;
        }
        UChar c=msg.charAt(index++);
        if(c==u_apos) {
            if(index==msg.length()) {
                // The apostrophe is the last character in the pattern. 
                // Add a Part for auto-quoting.
                addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                        u_apos, errorCode);  // value=char to be inserted
                needsAutoQuoting=TRUE;
            } else {
                c=msg.charAt(index);
                if(c==u_apos) {
                    // double apostrophe, skip the second one
                    addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index++, 1, 0, errorCode);
                } else if(
                    aposMode==UMSGPAT_APOS_DOUBLE_REQUIRED ||
                    c==u_leftCurlyBrace || c==u_rightCurlyBrace ||
                    (parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_pipe) ||
                    (UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(parentType) && c==u_pound)
                ) {
                    // skip the quote-starting apostrophe
                    addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index-1, 1, 0, errorCode);
                    // find the end of the quoted literal text
                    for(;;) {
                        index=msg.indexOf(u_apos, index+1);
                        if(index>=0) {
                            if(/*(index+1)<msg.length() &&*/ msg.charAt(index+1)==u_apos) {
                                // double apostrophe inside quoted literal text
                                // still encodes a single apostrophe, skip the second one
                                addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, ++index, 1, 0, errorCode);
                            } else {
                                // skip the quote-ending apostrophe
                                addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index++, 1, 0, errorCode);
                                break;
                            }
                        } else {
                            // The quoted text reaches to the end of the of the message.
                            index=msg.length();
                            // Add a Part for auto-quoting.
                            addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                                    u_apos, errorCode);  // value=char to be inserted
                            needsAutoQuoting=TRUE;
                            break;
                        }
                    }
                } else {
                    // Interpret the apostrophe as literal text.
                    // Add a Part for auto-quoting.
                    addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                            u_apos, errorCode);  // value=char to be inserted
                    needsAutoQuoting=TRUE;
                }
            }
        } else if(UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(parentType) && c==u_pound) {
            // The unquoted # in a plural message fragment will be replaced
            // with the (number-offset).
            addPart(UMSGPAT_PART_TYPE_REPLACE_NUMBER, index-1, 1, 0, errorCode);
        } else if(c==u_leftCurlyBrace) {
            index=parseArg(index-1, 1, nestingLevel, parseError, errorCode);
        } else if((nestingLevel>0 && c==u_rightCurlyBrace) ||
                  (parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_pipe)) {
            // Finish the message before the terminator.
            // In a choice style, report the "}" substring only for the following ARG_LIMIT,
            // not for this MSG_LIMIT.
            int32_t limitLength=(parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_rightCurlyBrace) ? 0 : 1;
            addLimitPart(msgStart, UMSGPAT_PART_TYPE_MSG_LIMIT, index-1, limitLength,
                         nestingLevel, errorCode);
            if(parentType==UMSGPAT_ARG_TYPE_CHOICE) {
                // Let the choice style parser see the '}' or '|'.
                return index-1;
            } else {
                // continue parsing after the '}'
                return index;
            }
        }  // else: c is part of literal text
    }
    if(nestingLevel>0 && !inTopLevelChoiceMessage(nestingLevel, parentType)) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    addLimitPart(msgStart, UMSGPAT_PART_TYPE_MSG_LIMIT, index, 0, nestingLevel, errorCode);
    return index;
}